

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SimpleSerialSimulationDataGenerator::CreateSerialByte(SimpleSerialSimulationDataGenerator *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  uint local_1c;
  byte local_16;
  U32 i;
  U8 mask;
  U8 byte;
  U32 samples_per_bit;
  SimpleSerialSimulationDataGenerator *this_local;
  
  pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)&this->mSerialText);
  bVar1 = *pbVar4;
  this->mStringIndex = this->mStringIndex + 1;
  uVar2 = this->mStringIndex;
  uVar5 = std::__cxx11::string::size();
  if (uVar2 == uVar5) {
    this->mStringIndex = 0;
  }
  iVar3 = (int)this;
  SimulationChannelDescriptor::Advance(iVar3 + 0x38);
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::Advance(iVar3 + 0x38);
  local_16 = 0x80;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    if ((bVar1 & local_16) == 0) {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar3 + 0x38);
    }
    else {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar3 + 0x38);
    }
    SimulationChannelDescriptor::Advance(iVar3 + 0x38);
    local_16 = (byte)((int)(uint)local_16 >> 1);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(iVar3 + 0x38);
  SimulationChannelDescriptor::Advance(iVar3 + 0x38);
  return;
}

Assistant:

void SimpleSerialSimulationDataGenerator::CreateSerialByte()
{
	U32 samples_per_bit = mSimulationSampleRateHz / mSettings->mBitRate;

	U8 byte = mSerialText[ mStringIndex ];
	mStringIndex++;
	if( mStringIndex == mSerialText.size() )
		mStringIndex = 0;

	//we're currenty high
	//let's move forward a little
	mSerialSimulationData.Advance( samples_per_bit * 10 );

	mSerialSimulationData.Transition();  //low-going edge for start bit
	mSerialSimulationData.Advance( samples_per_bit );  //add start bit time

	U8 mask = 0x1 << 7;
	for( U32 i=0; i<8; i++ )
	{
		if( ( byte & mask ) != 0 )
			mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
		else
			mSerialSimulationData.TransitionIfNeeded( BIT_LOW );

		mSerialSimulationData.Advance( samples_per_bit );
		mask = mask >> 1;
	}

	mSerialSimulationData.TransitionIfNeeded( BIT_HIGH ); //we need to end high

	//lets pad the end a bit for the stop bit:
	mSerialSimulationData.Advance( samples_per_bit );
}